

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_DirHashThreads_Test::TestBody
          (X509Test_DirHashThreads_Test *this)

{
  bool bVar1;
  char *pcVar2;
  X509_STORE *pXVar3;
  char *in_R9;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8c0;
  type local_8b8;
  type local_8a8;
  type local_898;
  type local_888;
  type local_878;
  type local_868;
  type local_858;
  ulong local_848;
  size_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  size_t kNumThreads;
  anon_class_8_1_a8a4e801 verify;
  AssertHelper local_7f8;
  Message local_7f0;
  int local_7e4;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_7b0;
  Message local_7a8;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar__18;
  UniquePtr<X509_STORE> store;
  AssertHelper local_768;
  Message local_760;
  undefined1 local_758 [8];
  AssertionResult gtest_ar__17;
  UniquePtr<X509> old_leaf2;
  AssertHelper local_720;
  Message local_718;
  undefined1 local_710 [8];
  AssertionResult gtest_ar__16;
  UniquePtr<X509> old_leaf1;
  Message local_6f0;
  uint local_6e4;
  size_t local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_3;
  Message local_6c0;
  uint local_6b4;
  size_t local_6b0;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_678;
  Message local_670;
  bool local_661;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_630;
  Message local_628;
  bool local_619;
  undefined1 local_618 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_5e8;
  Message local_5e0;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_5a0;
  Message local_598;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_558;
  Message local_550;
  bool local_541;
  undefined1 local_540 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_510;
  Message local_508;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__10;
  undefined1 local_4e0 [8];
  string old_ca2;
  undefined1 local_4b8 [8];
  string old_ca1;
  AssertHelper local_478;
  Message local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__9;
  UniquePtr<X509> leaf2;
  AssertHelper local_430;
  Message local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<X509> leaf1;
  Message local_400;
  uint local_3f4;
  size_t local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_1;
  Message local_3d0;
  uint local_3c4;
  size_t local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_340;
  Message local_338;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2b0;
  Message local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_268;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_220;
  Message local_218;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_1f0 [8];
  string ca2;
  undefined1 local_1c8 [8];
  string ca1;
  anon_class_16_2_441bd9f7 add_crl;
  anon_class_8_1_ba1d59bf issue_cert;
  anon_class_16_2_441bd9f7 add_root;
  AssertHelper local_160;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__1;
  TemporaryHashDir dir;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key;
  AssertHelper local_20;
  Message local_18;
  X509Test_DirHashThreads_Test *local_10;
  X509Test_DirHashThreads_Test *this_local;
  
  local_10 = this;
  bVar1 = bssl::SkipTempFileTests();
  if (bVar1) {
    testing::Message::Message(&local_18);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kSkip,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20ad,"");
    testing::internal::AssertHelper::operator=(&local_20,&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message(&local_18);
  }
  else {
    PrivateKeyFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
                      "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                     );
    testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_48,
               (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
    if (!bVar1) {
      testing::Message::Message(&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_78,(internal *)local_48,(AssertionResult *)0x8f28b1,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x20b1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_58,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      testing::Message::~Message(&local_50);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    if (bVar1) {
      TemporaryHashDir::TemporaryHashDir((TemporaryHashDir *)&gtest_ar__1.message_,1);
      local_149 = TemporaryHashDir::Init((TemporaryHashDir *)&gtest_ar__1.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_148,&local_149,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_158);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&add_root.dir,(internal *)local_148,(AssertionResult *)"dir.Init()",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20b7,pcVar2);
        testing::internal::AssertHelper::operator=(&local_160,&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        std::__cxx11::string::~string((string *)&add_root.dir);
        testing::Message::~Message(&local_158);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      if (bVar1) {
        ca1.field_2._8_8_ = &gtest_ar_.message_;
        add_crl.key = (UniquePtr<EVP_PKEY> *)&gtest_ar__1.message_;
        add_crl.dir = (TemporaryHashDir *)ca1.field_2._8_8_;
        issue_cert.key = (UniquePtr<EVP_PKEY> *)ca1.field_2._8_8_;
        add_root.key = add_crl.key;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c8,"Test CA 1191514847",
                   (allocator<char> *)(ca2.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(ca2.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1f0,"Test CA 1570301806",
                   (allocator<char> *)
                   ((long)&gtest_ar__2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&gtest_ar__2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 7));
        local_209 = TestBody::anon_class_16_2_441bd9f7::operator()
                              ((anon_class_16_2_441bd9f7 *)&issue_cert,(string *)local_1c8,kNewHash)
        ;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_208,&local_209,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
        if (!bVar1) {
          testing::Message::Message(&local_218);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_208,
                     (AssertionResult *)"add_root(ca1, kNewHash)","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_220,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x20d6,pcVar2);
          testing::internal::AssertHelper::operator=(&local_220,&local_218);
          testing::internal::AssertHelper::~AssertHelper(&local_220);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_218);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        if (bVar1) {
          local_251 = TestBody::anon_class_16_2_441bd9f7::operator()
                                ((anon_class_16_2_441bd9f7 *)&issue_cert,(string *)local_1f0,
                                 kNewHash);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_250,&local_251,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
          if (!bVar1) {
            testing::Message::Message(&local_260);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_250,
                       (AssertionResult *)"add_root(ca2, kNewHash)","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_268,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x20d7,pcVar2);
            testing::internal::AssertHelper::operator=(&local_268,&local_260);
            testing::internal::AssertHelper::~AssertHelper(&local_268);
            std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_260);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
          if (bVar1) {
            local_299 = TestBody::anon_class_16_2_441bd9f7::operator()
                                  ((anon_class_16_2_441bd9f7 *)((long)&ca1.field_2 + 8),
                                   (string *)local_1c8,-2,kNewHash);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_298,&local_299,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
            if (!bVar1) {
              testing::Message::Message(&local_2a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_298,
                         (AssertionResult *)"add_crl(ca1, -2, kNewHash)","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2b0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20d8,pcVar2);
              testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
              testing::internal::AssertHelper::~AssertHelper(&local_2b0);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_2a8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
            if (bVar1) {
              local_2e1 = TestBody::anon_class_16_2_441bd9f7::operator()
                                    ((anon_class_16_2_441bd9f7 *)((long)&ca1.field_2 + 8),
                                     (string *)local_1f0,-1,kNewHash);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
              if (!bVar1) {
                testing::Message::Message(&local_2f0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__6.message_,(internal *)local_2e0,
                           (AssertionResult *)"add_crl(ca2, -1, kNewHash)","false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x20d9,pcVar2);
                testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
                testing::internal::AssertHelper::~AssertHelper(&local_2f8);
                std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_2f0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
              if (bVar1) {
                local_329 = TestBody::anon_class_16_2_441bd9f7::operator()
                                      ((anon_class_16_2_441bd9f7 *)((long)&ca1.field_2 + 8),
                                       (string *)local_1f0,-2,kNewHash);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_328,&local_329,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_328);
                if (!bVar1) {
                  testing::Message::Message(&local_338);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__7.message_,(internal *)local_328,
                             (AssertionResult *)"add_crl(ca2, -2, kNewHash)","false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_340,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x20da,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_340,&local_338);
                  testing::internal::AssertHelper::~AssertHelper(&local_340);
                  std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_338);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
                if (bVar1) {
                  local_371 = TestBody::anon_class_16_2_441bd9f7::operator()
                                        ((anon_class_16_2_441bd9f7 *)((long)&ca1.field_2 + 8),
                                         (string *)local_1c8,-1,kNewHash);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_370,&local_371,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_370);
                  if (!bVar1) {
                    testing::Message::Message(&local_380);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar.message_,(internal *)local_370,
                               (AssertionResult *)"add_crl(ca1, -1, kNewHash)","false","true",in_R9)
                    ;
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_388,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x20db,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_388,&local_380);
                    testing::internal::AssertHelper::~AssertHelper(&local_388);
                    std::__cxx11::string::~string((string *)&gtest_ar.message_);
                    testing::Message::~Message(&local_380);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
                  if (bVar1) {
                    local_3c0 = TemporaryHashDir::num_cert_hashes
                                          ((TemporaryHashDir *)&gtest_ar__1.message_);
                    local_3c4 = 1;
                    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                              ((EqHelper *)local_3b8,"dir.num_cert_hashes()","1u",&local_3c0,
                               &local_3c4);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_3b8);
                    if (!bVar1) {
                      testing::Message::Message(&local_3d0);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_3b8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                 ,0x20dd,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_1.message_,&local_3d0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_1.message_);
                      testing::Message::~Message(&local_3d0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
                    if (bVar1) {
                      local_3f0 = TemporaryHashDir::num_crl_hashes
                                            ((TemporaryHashDir *)&gtest_ar__1.message_);
                      local_3f4 = 1;
                      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                                ((EqHelper *)local_3e8,"dir.num_crl_hashes()","1u",&local_3f0,
                                 &local_3f4);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3e8);
                      if (!bVar1) {
                        testing::Message::Message(&local_400);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_3e8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&leaf1,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                   ,0x20de,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&leaf1,&local_400);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf1);
                        testing::Message::~Message(&local_400);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
                      if (bVar1) {
                        TestBody::anon_class_8_1_ba1d59bf::operator()
                                  ((anon_class_8_1_ba1d59bf *)&gtest_ar__8.message_,
                                   (string *)&add_crl.dir);
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_420,
                                   (unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__8.message_,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_420);
                        if (!bVar1) {
                          testing::Message::Message(&local_428);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&leaf2,(internal *)local_420,
                                     (AssertionResult *)0x89a170,"false","true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_430,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                     ,0x20e0,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_430,&local_428);
                          testing::internal::AssertHelper::~AssertHelper(&local_430);
                          std::__cxx11::string::~string((string *)&leaf2);
                          testing::Message::~Message(&local_428);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
                        if (bVar1) {
                          TestBody::anon_class_8_1_ba1d59bf::operator()
                                    ((anon_class_8_1_ba1d59bf *)&gtest_ar__9.message_,
                                     (string *)&add_crl.dir);
                          testing::AssertionResult::
                          AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                                    ((AssertionResult *)local_468,
                                     (unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__9.message_,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_468);
                          if (!bVar1) {
                            testing::Message::Message(&local_470);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)((long)&old_ca1.field_2 + 8),(internal *)local_468,
                                       (AssertionResult *)0x89a17a,"false","true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_478,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20e2,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_478,&local_470);
                            testing::internal::AssertHelper::~AssertHelper(&local_478);
                            std::__cxx11::string::~string
                                      ((string *)(old_ca1.field_2._M_local_buf + 8));
                            testing::Message::~Message(&local_470);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
                          if (bVar1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_4b8,"Test CA 1069881739",
                                       (allocator<char> *)(old_ca2.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(old_ca2.field_2._M_local_buf + 0xf));
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_4e0,"Test CA 940754110",
                                       (allocator<char> *)
                                       ((long)&gtest_ar__10.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 7));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)
                                       ((long)&gtest_ar__10.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 7));
                            local_4f9 = TestBody::anon_class_16_2_441bd9f7::operator()
                                                  ((anon_class_16_2_441bd9f7 *)&issue_cert,
                                                   (string *)local_4b8,kOldHash);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_4f8);
                            if (!bVar1) {
                              testing::Message::Message(&local_508);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__11.message_,(internal *)local_4f8,
                                         (AssertionResult *)"add_root(old_ca1, kOldHash)","false",
                                         "true",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_510,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                         ,0x20e7,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_510,&local_508);
                              testing::internal::AssertHelper::~AssertHelper(&local_510);
                              std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                              testing::Message::~Message(&local_508);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8)
                            ;
                            if (bVar1) {
                              local_541 = TestBody::anon_class_16_2_441bd9f7::operator()
                                                    ((anon_class_16_2_441bd9f7 *)&issue_cert,
                                                     (string *)local_4e0,kOldHash);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_540,&local_541,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_540);
                              if (!bVar1) {
                                testing::Message::Message(&local_550);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__12.message_,(internal *)local_540,
                                           (AssertionResult *)"add_root(old_ca2, kOldHash)","false",
                                           "true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_558,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                           ,0x20e8,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_558,&local_550);
                                testing::internal::AssertHelper::~AssertHelper(&local_558);
                                std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                                testing::Message::~Message(&local_550);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_540);
                              if (bVar1) {
                                local_589 = TestBody::anon_class_16_2_441bd9f7::operator()
                                                      ((anon_class_16_2_441bd9f7 *)
                                                       ((long)&ca1.field_2 + 8),(string *)local_4b8,
                                                       -2,kOldHash);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_588,&local_589,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_588);
                                if (!bVar1) {
                                  testing::Message::Message(&local_598);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__13.message_,(internal *)local_588,
                                             (AssertionResult *)"add_crl(old_ca1, -2, kOldHash)",
                                             "false","true",in_R9);
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_5a0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                             ,0x20e9,pcVar2);
                                  testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
                                  testing::internal::AssertHelper::~AssertHelper(&local_5a0);
                                  std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                                  testing::Message::~Message(&local_598);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_588);
                                if (bVar1) {
                                  local_5d1 = TestBody::anon_class_16_2_441bd9f7::operator()
                                                        ((anon_class_16_2_441bd9f7 *)
                                                         ((long)&ca1.field_2 + 8),
                                                         (string *)local_4e0,-1,kOldHash);
                                  testing::AssertionResult::AssertionResult<bool>
                                            ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_5d0);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_5e0);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar__14.message_,
                                               (internal *)local_5d0,
                                               (AssertionResult *)"add_crl(old_ca2, -1, kOldHash)",
                                               "false","true",in_R9);
                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_5e8,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                               ,0x20ea,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              (&local_5e8,&local_5e0);
                                    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
                                    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                                    testing::Message::~Message(&local_5e0);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_5d0);
                                  if (bVar1) {
                                    local_619 = TestBody::anon_class_16_2_441bd9f7::operator()
                                                          ((anon_class_16_2_441bd9f7 *)
                                                           ((long)&ca1.field_2 + 8),
                                                           (string *)local_4e0,-2,kOldHash);
                                    testing::AssertionResult::AssertionResult<bool>
                                              ((AssertionResult *)local_618,&local_619,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_618);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_628);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar__15.message_,
                                                 (internal *)local_618,
                                                 (AssertionResult *)"add_crl(old_ca2, -2, kOldHash)"
                                                 ,"false","true",in_R9);
                                      pcVar2 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_630,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                 ,0x20eb,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                (&local_630,&local_628);
                                      testing::internal::AssertHelper::~AssertHelper(&local_630);
                                      std::__cxx11::string::~string
                                                ((string *)&gtest_ar__15.message_);
                                      testing::Message::~Message(&local_628);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_618);
                                    if (bVar1) {
                                      local_661 = TestBody::anon_class_16_2_441bd9f7::operator()
                                                            ((anon_class_16_2_441bd9f7 *)
                                                             ((long)&ca1.field_2 + 8),
                                                             (string *)local_4b8,-1,kOldHash);
                                      testing::AssertionResult::AssertionResult<bool>
                                                ((AssertionResult *)local_660,&local_661,(type *)0x0
                                                );
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_660);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_670);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)&gtest_ar_2.message_,
                                                   (internal *)local_660,
                                                   (AssertionResult *)
                                                   "add_crl(old_ca1, -1, kOldHash)","false","true",
                                                   in_R9);
                                        pcVar2 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_678,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                  ,0x20ec,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_678,&local_670);
                                        testing::internal::AssertHelper::~AssertHelper(&local_678);
                                        std::__cxx11::string::~string
                                                  ((string *)&gtest_ar_2.message_);
                                        testing::Message::~Message(&local_670);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_660);
                                      if (bVar1) {
                                        local_6b0 = TemporaryHashDir::num_cert_hashes
                                                              ((TemporaryHashDir *)
                                                               &gtest_ar__1.message_);
                                        local_6b4 = 2;
                                        testing::internal::EqHelper::
                                        Compare<unsigned_long,_unsigned_int,_nullptr>
                                                  ((EqHelper *)local_6a8,"dir.num_cert_hashes()",
                                                   "2u",&local_6b0,&local_6b4);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_6a8);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_6c0);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_6a8);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_3.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                  ,0x20ee,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_3.message_,&local_6c0
                                                    );
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_3.message_);
                                          testing::Message::~Message(&local_6c0);
                                        }
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_6a8);
                                        if (bVar1) {
                                          local_6e0 = TemporaryHashDir::num_crl_hashes
                                                                ((TemporaryHashDir *)
                                                                 &gtest_ar__1.message_);
                                          local_6e4 = 2;
                                          testing::internal::EqHelper::
                                          Compare<unsigned_long,_unsigned_int,_nullptr>
                                                    ((EqHelper *)local_6d8,"dir.num_crl_hashes()",
                                                     "2u",&local_6e0,&local_6e4);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_6d8);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_6f0);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_6d8);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&old_leaf1,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                  ,0x20ef,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&old_leaf1,&local_6f0);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&old_leaf1);
                                            testing::Message::~Message(&local_6f0);
                                          }
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_6d8);
                                          if (bVar1) {
                                            TestBody::anon_class_8_1_ba1d59bf::operator()
                                                      ((anon_class_8_1_ba1d59bf *)
                                                       &gtest_ar__16.message_,(string *)&add_crl.dir
                                                      );
                                            testing::AssertionResult::
                                            AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                                                      ((AssertionResult *)local_710,
                                                       (unique_ptr<x509_st,_bssl::internal::Deleter>
                                                        *)&gtest_ar__16.message_,(type *)0x0);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_710);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_718);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        ((string *)&old_leaf2,(internal *)local_710,
                                                         (AssertionResult *)"old_leaf1","false",
                                                         "true",in_R9);
                                              pcVar2 = (char *)std::__cxx11::string::c_str();
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_720,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                  ,0x20f1,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_720,&local_718);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_720);
                                              std::__cxx11::string::~string((string *)&old_leaf2);
                                              testing::Message::~Message(&local_718);
                                            }
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_710);
                                            if (bVar1) {
                                              TestBody::anon_class_8_1_ba1d59bf::operator()
                                                        ((anon_class_8_1_ba1d59bf *)
                                                         &gtest_ar__17.message_,
                                                         (string *)&add_crl.dir);
                                              testing::AssertionResult::
                                              AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                                                        ((AssertionResult *)local_758,
                                                         (
                                                  unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__17.message_,(type *)0x0);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_758);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_760);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)&store,(internal *)local_758,
                                                           (AssertionResult *)"old_leaf2","false",
                                                           "true",in_R9);
                                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_768,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                  ,0x20f3,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_768,&local_760);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_768);
                                                std::__cxx11::string::~string((string *)&store);
                                                testing::Message::~Message(&local_760);
                                              }
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_758);
                                              if (bVar1) {
                                                pXVar3 = X509_STORE_new();
                                                std::
                                                unique_ptr<x509_store_st,bssl::internal::Deleter>::
                                                unique_ptr<bssl::internal::Deleter,void>
                                                          ((
                                                  unique_ptr<x509_store_st,bssl::internal::Deleter>
                                                  *)&gtest_ar__18.message_,(pointer)pXVar3);
                                                testing::AssertionResult::
                                                AssertionResult<std::unique_ptr<x509_store_st,bssl::internal::Deleter>>
                                                          ((AssertionResult *)local_7a0,
                                                           (
                                                  unique_ptr<x509_store_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__18.message_,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_7a0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_7a8);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__19.message_,
                                                             (internal *)local_7a0,
                                                             (AssertionResult *)0x8377c0,"false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_7b0,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                  ,0x20f7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_7b0,&local_7a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_7b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__19.message_);
                                                  testing::Message::~Message(&local_7a8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_7a0);
                                                if (bVar1) {
                                                  pXVar3 = (X509_STORE *)
                                                           std::
                                                  unique_ptr<x509_store_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<x509_store_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__18.message_);
                                                  (anonymous_namespace)::TemporaryHashDir::
                                                  path_abi_cxx11_((TemporaryHashDir *)
                                                                  &gtest_ar__1.message_);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  local_7e4 = X509_STORE_load_locations
                                                                        (pXVar3,(char *)0x0,pcVar2);
                                                  testing::AssertionResult::AssertionResult<int>
                                                            ((AssertionResult *)local_7e0,&local_7e4
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_7f0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&verify,
                                                               (internal *)local_7e0,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "X509_STORE_load_locations(store.get(), nullptr, dir.path().c_str())"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_7f8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                  ,0x20f9,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_7f8,&local_7f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_7f8);
                                                  std::__cxx11::string::~string((string *)&verify);
                                                  testing::Message::~Message(&local_7f0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7e0);
                                                  if (bVar1) {
                                                    kNumThreads = (size_t)&gtest_ar__18.message_;
                                                    threads.
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0xa;
                                                  std::
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  ::vector((
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  *)&i);
                                                  for (local_848 = 0; local_848 < 10;
                                                      local_848 = local_848 + 1) {
                                                    local_858.verify =
                                                         (anon_class_8_1_a8a4e801 *)&kNumThreads;
                                                    local_858.leaf1 =
                                                         (UniquePtr<X509> *)&gtest_ar__8.message_;
                                                    std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__0>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,&local_858);
                                                  local_868.verify =
                                                       (anon_class_8_1_a8a4e801 *)&kNumThreads;
                                                  local_868.leaf1 =
                                                       (UniquePtr<X509> *)&gtest_ar__8.message_;
                                                  std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__1>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,&local_868);
                                                  local_878.verify =
                                                       (anon_class_8_1_a8a4e801 *)&kNumThreads;
                                                  local_878.leaf2 =
                                                       (UniquePtr<X509> *)&gtest_ar__9.message_;
                                                  std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__2>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,&local_878);
                                                  local_888.verify =
                                                       (anon_class_8_1_a8a4e801 *)&kNumThreads;
                                                  local_888.leaf2 =
                                                       (UniquePtr<X509> *)&gtest_ar__9.message_;
                                                  std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__3>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,&local_888);
                                                  local_898.verify =
                                                       (anon_class_8_1_a8a4e801 *)&kNumThreads;
                                                  local_898.old_leaf1 =
                                                       (UniquePtr<X509> *)&gtest_ar__16.message_;
                                                  std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__4>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,&local_898);
                                                  local_8a8.verify =
                                                       (anon_class_8_1_a8a4e801 *)&kNumThreads;
                                                  local_8a8.old_leaf1 =
                                                       (UniquePtr<X509> *)&gtest_ar__16.message_;
                                                  std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__5>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,&local_8a8);
                                                  local_8b8.verify =
                                                       (anon_class_8_1_a8a4e801 *)&kNumThreads;
                                                  local_8b8.old_leaf2 =
                                                       (UniquePtr<X509> *)&gtest_ar__17.message_;
                                                  std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__6>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,&local_8b8);
                                                  __range1 = (
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  *)&kNumThreads;
                                                  local_8c0 = &gtest_ar__17.message_;
                                                  std::
                                                  vector<std::thread,std::allocator<std::thread>>::
                                                  emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__7>
                                                            ((
                                                  vector<std::thread,std::allocator<std::thread>> *)
                                                  &i,(type *)&__range1);
                                                  }
                                                  __end1 = std::
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  ::begin((
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  *)&i);
                                                  thread = (thread *)
                                                           std::
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  ::end((
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  *)&i);
                                                  while (bVar1 = __gnu_cxx::operator!=
                                                                           (&__end1,(
                                                  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                                  *)&thread), bVar1) {
                                                    __gnu_cxx::
                                                                                                        
                                                  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                                  ::operator*(&__end1);
                                                  std::thread::join();
                                                  __gnu_cxx::
                                                  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                                  ::operator++(&__end1);
                                                  }
                                                  std::
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  ::~vector((
                                                  vector<std::thread,_std::allocator<std::thread>_>
                                                  *)&i);
                                                  }
                                                }
                                                std::
                                                unique_ptr<x509_store_st,_bssl::internal::Deleter>::
                                                ~unique_ptr((
                                                  unique_ptr<x509_store_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__18.message_);
                                              }
                                              std::unique_ptr<x509_st,_bssl::internal::Deleter>::
                                              ~unique_ptr((
                                                  unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__17.message_);
                                            }
                                            std::unique_ptr<x509_st,_bssl::internal::Deleter>::
                                            ~unique_ptr((
                                                  unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__16.message_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            std::__cxx11::string::~string((string *)local_4e0);
                            std::__cxx11::string::~string((string *)local_4b8);
                          }
                          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__9.message_);
                        }
                        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__8.message_);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)local_1f0);
        std::__cxx11::string::~string((string *)local_1c8);
      }
      TemporaryHashDir::~TemporaryHashDir((TemporaryHashDir *)&gtest_ar__1.message_);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  }
  return;
}

Assistant:

TEST(X509Test, DirHashThreads) {
  if (bssl::SkipTempFileTests()) {
    GTEST_SKIP();
  }

  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  // Generate some roots and fill a directory with OpenSSL's directory hash
  // format. The hash depends only on the name, so we do not need to
  // pre-generate the certificates. Test both DER and PEM.
  TemporaryHashDir dir(X509_FILETYPE_PEM);
  ASSERT_TRUE(dir.Init());

  auto add_root = [&](const std::string &name, NameHash name_hash) -> bool {
    bssl::UniquePtr<X509> ca =
        MakeTestCert(name.c_str(), name.c_str(), key.get(), /*is_ca=*/true);
    return ca != nullptr &&  //
           X509_sign(ca.get(), key.get(), EVP_sha256()) &&
           dir.AddCert(ca.get(), name_hash);
  };

  auto issue_cert = [&](const std::string &issuer) -> bssl::UniquePtr<X509> {
    bssl::UniquePtr<X509> cert =
        MakeTestCert(issuer.c_str(), "Leaf", key.get(), /*is_ca=*/false);
    if (cert == nullptr || !X509_sign(cert.get(), key.get(), EVP_sha256())) {
      return nullptr;
    }
    return cert;
  };

  auto add_crl = [&](const std::string &name, int this_update_offset_day,
                     NameHash name_hash) -> bool {
    bssl::UniquePtr<X509_CRL> crl = MakeTestCRL(
        name.c_str(), this_update_offset_day, /*next_update_offset_day=*/1);
    return crl != nullptr &&
           X509_CRL_sign(crl.get(), key.get(), EVP_sha256()) &&
           dir.AddCRL(crl.get(), name_hash);
  };

  // These two CAs collide under |X509_NAME_hash|.
  std::string ca1 = "Test CA 1191514847";
  std::string ca2 = "Test CA 1570301806";
  ASSERT_TRUE(add_root(ca1, kNewHash));
  ASSERT_TRUE(add_root(ca2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -1, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -1, kNewHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 1u);
  ASSERT_EQ(dir.num_crl_hashes(), 1u);
  bssl::UniquePtr<X509> leaf1 = issue_cert(ca1);
  ASSERT_TRUE(leaf1);
  bssl::UniquePtr<X509> leaf2 = issue_cert(ca2);
  ASSERT_TRUE(leaf2);

  // These two CAs collide under |X509_NAME_hash_old|.
  std::string old_ca1 = "Test CA 1069881739";
  std::string old_ca2 = "Test CA 940754110";
  ASSERT_TRUE(add_root(old_ca1, kOldHash));
  ASSERT_TRUE(add_root(old_ca2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -1, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -1, kOldHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 2u);
  ASSERT_EQ(dir.num_crl_hashes(), 2u);
  bssl::UniquePtr<X509> old_leaf1 = issue_cert(old_ca1);
  ASSERT_TRUE(old_leaf1);
  bssl::UniquePtr<X509> old_leaf2 = issue_cert(old_ca2);
  ASSERT_TRUE(old_leaf2);

  // Make an |X509_STORE| that gets CAs from |dir|.
  bssl::UniquePtr<X509_STORE> store(X509_STORE_new());
  ASSERT_TRUE(store);
  ASSERT_TRUE(X509_STORE_load_locations(store.get(), /*file=*/nullptr,
                                        dir.path().c_str()));

  auto verify = [&](X509 *cert, bool crl_check) {
    bssl::UniquePtr<X509_STORE_CTX> ctx(X509_STORE_CTX_new());
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(X509_STORE_CTX_init(ctx.get(), store.get(), cert,
                                    /*chain=*/nullptr));
    X509_STORE_CTX_set_flags(ctx.get(), crl_check ? X509_V_FLAG_CRL_CHECK : 0);
    X509_STORE_CTX_set_time_posix(ctx.get(), /*flags=*/0, kReferenceTime);
    EXPECT_TRUE(X509_verify_cert(ctx.get()))
        << X509_verify_cert_error_string(X509_STORE_CTX_get_error(ctx.get()));
  };

  const size_t kNumThreads = 10;
  std::vector<std::thread> threads;
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back([&] { verify(leaf1.get(), false); });
    threads.emplace_back([&] { verify(leaf1.get(), true); });
    threads.emplace_back([&] { verify(leaf2.get(), false); });
    threads.emplace_back([&] { verify(leaf2.get(), true); });

    threads.emplace_back([&] { verify(old_leaf1.get(), false); });
    threads.emplace_back([&] { verify(old_leaf1.get(), true); });
    threads.emplace_back([&] { verify(old_leaf2.get(), false); });
    threads.emplace_back([&] { verify(old_leaf2.get(), true); });
  }
  for (auto &thread : threads) {
    thread.join();
  }
}